

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O3

xmlEntityPtr xmlGetDtdEntity(xmlDocPtr doc,xmlChar *name)

{
  xmlHashTablePtr table;
  xmlEntityPtr pxVar1;
  
  if (((doc != (xmlDocPtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) &&
     (table = (xmlHashTablePtr)doc->extSubset->entities, table != (xmlHashTablePtr)0x0)) {
    pxVar1 = (xmlEntityPtr)xmlHashLookup(table,name);
    return pxVar1;
  }
  return (xmlEntityPtr)0x0;
}

Assistant:

xmlEntityPtr
xmlGetDtdEntity(xmlDocPtr doc, const xmlChar *name) {
    xmlEntitiesTablePtr table;

    if (doc == NULL)
	return(NULL);
    if ((doc->extSubset != NULL) && (doc->extSubset->entities != NULL)) {
	table = (xmlEntitiesTablePtr) doc->extSubset->entities;
	return(xmlGetEntityFromTable(table, name));
    }
    return(NULL);
}